

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  char *pcVar3;
  uint uVar4;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar5;
  PrimRefMB *pPVar6;
  MemoryMonitorInterface *pMVar7;
  mvector<embree::PrimRefMB> *pmVar8;
  code *pcVar9;
  ThreadLocal2 *pTVar10;
  Scene *pSVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  BBox1f BVar15;
  BBox1f BVar16;
  bool bVar17;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar18;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar19;
  undefined8 uVar20;
  char cVar21;
  mvector<PrimRefMB> *prims;
  long lVar22;
  __uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
  _Var23;
  void *pvVar24;
  undefined8 *puVar25;
  runtime_error *prVar26;
  long lVar27;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar28;
  size_t sVar29;
  float *pfVar30;
  unsigned_long uVar31;
  range<unsigned_long> *prVar32;
  BuildRecord *this_00;
  Split *pSVar33;
  char *pcVar34;
  ulong uVar35;
  int iVar36;
  size_t sVar37;
  ulong uVar38;
  ulong uVar39;
  unsigned_long uVar40;
  size_t i_3;
  SetMB *this_01;
  LocalChildListSplit *in_00;
  BBox1f *pBVar41;
  int iVar42;
  size_t i_5;
  Split *pSVar43;
  bool bVar44;
  bool bVar45;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar49;
  float fVar51;
  undefined1 auVar50 [16];
  float fVar52;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar53;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar54;
  float fVar56;
  float fVar57;
  undefined1 auVar55 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 local_1e68 [16];
  undefined8 uStack_1e60;
  undefined1 local_1e58 [16];
  ulong local_1e40;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1e28 [16];
  undefined1 local_1e18 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1dd8;
  PrimRefVector lprims;
  BBox<embree::Vec3fa> bi;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1da8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1d98 [8];
  anon_class_1_0_00000001 reduction;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_1c88 [16];
  BBox<embree::Vec3fa> blower1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c38;
  undefined4 local_1c28;
  undefined4 uStack_1c24;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1bd8;
  PrimInfoMB right;
  anon_class_24_3_c5d13451 isLeft;
  unsigned_long local_1a98;
  unsigned_long local_1a90;
  BBox<embree::Vec3fa> bupper0;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_19c8;
  vint vSplitPos;
  BuildRecordSplit current;
  LocalChildListSplit children;
  NodeRecordMB4D values [16];
  
  children.children.items[0].super_BuildRecord.depth = in->depth;
  if ((this->cfg).maxDepth < children.children.items[0].super_BuildRecord.depth) {
    puVar25 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&children,"depth limit reached",(allocator *)values);
    *puVar25 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar25 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar25 + 2),(string *)&children);
    __cxa_throw(puVar25,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  SetMB::SetMB(&children.children.items[0].super_BuildRecord.prims,&in->prims);
  findFallback((Split *)values,this,&in->prims);
  BuildRecord::BuildRecord(&current.super_BuildRecord,(BuildRecord *)&children);
  current.split.sah = (float)values[0].ref.ptr;
  current.split.dim = (int)values[0].ref.ptr._4_4_;
  current.split.mapping.ofs.field_0._0_8_ = values[0].lbounds.bounds0.upper.field_0._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = values[0].lbounds.bounds0.upper.field_0._8_8_;
  current.split.mapping.scale.field_0._0_8_ = values[0].lbounds.bounds1.lower.field_0._0_8_;
  current.split.mapping.scale.field_0._8_8_ = values[0].lbounds.bounds1.lower.field_0._8_8_;
  uVar40 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if (current.super_BuildRecord.depth == 1) {
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end ==
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin) {
      bVar44 = false;
      uVar40 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
    }
    else {
      lVar22 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin * 0x50 + 0x44;
      fVar69 = INFINITY;
      fVar74 = -INFINITY;
      for (uVar31 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
          uVar31 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
          uVar31 = uVar31 + 1) {
        fVar73 = *(float *)((long)(current.super_BuildRecord.prims.prims)->items + lVar22 + -4);
        if (fVar73 <= fVar69) {
          fVar69 = fVar73;
        }
        fVar73 = *(float *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0
                                   .lower.field_0 + lVar22);
        if (fVar73 <= fVar74) {
          fVar73 = fVar74;
        }
        lVar22 = lVar22 + 0x50;
        fVar74 = fVar73;
      }
      bVar44 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower < fVar69 ||
               fVar74 < current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
    }
  }
  else {
    bVar44 = false;
  }
  uVar38 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end - uVar40;
  if (((uVar38 <= (this->cfg).maxLeafSize) && ((uint)values[0]._12_4_ < 2)) && (!bVar44)) {
    bupper0.lower.field_0._0_8_ = uVar38 * 8;
    pTVar10 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar10;
      MutexSys::lock(&pTVar10->mutex);
      if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
             ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar10->alloc0).bytesUsed = 0;
      (pTVar10->alloc0).bytesWasted = 0;
      (pTVar10->alloc0).end = 0;
      (pTVar10->alloc0).allocBlockSize = 0;
      (pTVar10->alloc0).ptr = (char *)0x0;
      (pTVar10->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
      }
      else {
        (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar10->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      children.children.items[0].super_BuildRecord.depth =
           (size_t)&FastAllocator::s_thread_local_allocators_lock;
      children.children.items[0].super_BuildRecord._8_1_ = 1;
      blower1.lower.field_0._0_8_ = pTVar10;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&blower1);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&children);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)values);
    }
    uVar20 = bupper0.lower.field_0._0_8_;
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + bupper0.lower.field_0._0_8_;
    sVar29 = (alloc.talloc1)->cur;
    uVar35 = (ulong)(-(int)sVar29 & 0xf);
    uVar39 = sVar29 + bupper0.lower.field_0._0_8_ + uVar35;
    (alloc.talloc1)->cur = uVar39;
    if ((alloc.talloc1)->end < uVar39) {
      (alloc.talloc1)->cur = sVar29;
      uVar39 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(bupper0.lower.field_0._0_8_ * 4) < uVar39 ||
          bupper0.lower.field_0._0_8_ * 4 - uVar39 == 0) {
        children.children.items[0].super_BuildRecord.depth = uVar39;
        pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
        (alloc.talloc1)->ptr = pcVar34;
        sVar29 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar29;
        (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
        (alloc.talloc1)->cur = uVar20;
        if (children.children.items[0].super_BuildRecord.depth < (ulong)uVar20) {
          (alloc.talloc1)->cur = 0;
          children.children.items[0].super_BuildRecord.depth = (alloc.talloc1)->allocBlockSize;
          pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
          (alloc.talloc1)->ptr = pcVar34;
          sVar29 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar29;
          (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
          (alloc.talloc1)->cur = uVar20;
          if (children.children.items[0].super_BuildRecord.depth < (ulong)uVar20) {
            (alloc.talloc1)->cur = 0;
            pcVar34 = (char *)0x0;
            goto LAB_004d5b76;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar29;
      }
      else {
        pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&bupper0);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar35;
      pcVar34 = (alloc.talloc1)->ptr + (uVar39 - bupper0.lower.field_0._0_8_);
    }
LAB_004d5b76:
    uVar39 = 7;
    if (uVar38 < 7) {
      uVar39 = uVar38;
    }
    aVar46 = _DAT_01f45a40;
    aVar49 = _DAT_01f45a30;
    aVar53 = _DAT_01f45a30;
    aVar54 = _DAT_01f45a40;
    for (uVar35 = 0; uVar35 != uVar38; uVar35 = uVar35 + 1) {
      pSVar11 = ((this->createLeaf).bvh)->scene;
      fVar74 = (current.super_BuildRecord.prims.prims)->items[uVar40].lbounds.bounds0.lower.field_0.
               m128[3];
      fVar69 = (current.super_BuildRecord.prims.prims)->items[uVar40].lbounds.bounds0.upper.field_0.
               m128[3];
      isLeft.split = (Split *)(ulong)(uint)fVar69;
      *(float *)(pcVar34 + uVar35 * 8) = fVar74;
      *(float *)(pcVar34 + uVar35 * 8 + 4) = fVar69;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           (pSVar11->geometries).items[(uint)fVar74].ptr;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           &isLeft;
      fVar74 = ((Geometry *)
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_)->fnumTimeSegments;
      fVar69 = (((Geometry *)
                right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_)->time_range).lower;
      fVar79 = (((Geometry *)
                right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_)->time_range).upper - fVar69;
      fVar77 = (current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower - fVar69) / fVar79
      ;
      fVar79 = (current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper - fVar69) / fVar79
      ;
      fVar78 = fVar74 * fVar79;
      fVar69 = floorf(fVar74 * fVar77);
      fVar73 = ceilf(fVar78);
      iVar42 = (int)fVar69;
      if (fVar69 <= 0.0) {
        fVar69 = 0.0;
      }
      fVar80 = fVar73;
      if (fVar74 <= fVar73) {
        fVar80 = fVar74;
      }
      iVar36 = -1;
      if (-1 < iVar42) {
        iVar36 = iVar42;
      }
      iVar14 = (int)fVar74 + 1;
      if ((int)fVar73 < (int)fVar74 + 1) {
        iVar14 = (int)fVar73;
      }
      AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                ((BBox3fa *)&children,(anon_class_16_2_4e716a3c *)&right,(long)(int)fVar69);
      AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                ((BBox3fa *)values,(anon_class_16_2_4e716a3c *)&right,(long)(int)fVar80);
      fVar73 = fVar74 * fVar77 - fVar69;
      if (iVar14 - iVar36 == 1) {
        if (fVar73 <= 0.0) {
          fVar73 = 0.0;
        }
        fVar74 = 1.0 - fVar73;
        fVar61 = fVar74 * (float)children.children.items[0].super_BuildRecord.depth +
                 fVar73 * (float)values[0].ref.ptr;
        fVar62 = fVar74 * children.children.items[0].super_BuildRecord.depth._4_4_ +
                 fVar73 * values[0].ref.ptr._4_4_;
        fVar63 = fVar74 * (float)children.children.items[0].super_BuildRecord._8_4_ +
                 fVar73 * (float)values[0]._8_4_;
        fVar64 = fVar74 * (float)children.children.items[0].super_BuildRecord._12_4_ +
                 fVar73 * (float)values[0]._12_4_;
        fVar81 = fVar74 * children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                          super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                          field_0.m128[0] +
                 fVar73 * (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
        fVar59 = fVar74 * children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                          super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                          field_0.m128[1] +
                 fVar73 * (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
        fVar60 = fVar74 * children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                          super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                          field_0.m128[2] +
                 fVar73 * (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
        fVar73 = fVar74 * children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                          super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                          field_0.m128[3] +
                 fVar73 * (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
        fVar74 = fVar80 - fVar78;
        if (fVar80 - fVar78 <= 0.0) {
          fVar74 = 0.0;
        }
        fVar69 = 1.0 - fVar74;
        auVar66._0_4_ =
             (float)values[0].ref.ptr * fVar69 +
             (float)children.children.items[0].super_BuildRecord.depth * fVar74;
        auVar66._4_4_ =
             values[0].ref.ptr._4_4_ * fVar69 +
             children.children.items[0].super_BuildRecord.depth._4_4_ * fVar74;
        auVar66._8_4_ =
             (float)values[0]._8_4_ * fVar69 +
             (float)children.children.items[0].super_BuildRecord._8_4_ * fVar74;
        auVar66._12_4_ =
             (float)values[0]._12_4_ * fVar69 +
             (float)children.children.items[0].super_BuildRecord._12_4_ * fVar74;
        auVar55._0_4_ =
             fVar69 * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
             fVar74 * children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                      super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0.m128[0];
        auVar55._4_4_ =
             fVar69 * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
             fVar74 * children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                      super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0.m128[1];
        auVar55._8_4_ =
             fVar69 * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
             fVar74 * children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                      super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0.m128[2];
        auVar55._12_4_ =
             fVar69 * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
             fVar74 * children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                      super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0.m128[3];
      }
      else {
        AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&blower1,(anon_class_16_2_4e716a3c *)&right,(long)((int)fVar69 + 1));
        AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&bupper0,(anon_class_16_2_4e716a3c *)&right,(long)((int)fVar80 + -1));
        if (fVar73 <= 0.0) {
          fVar73 = 0.0;
        }
        fVar69 = 1.0 - fVar73;
        fVar61 = (float)children.children.items[0].super_BuildRecord.depth * fVar69 +
                 blower1.lower.field_0.m128[0] * fVar73;
        fVar62 = children.children.items[0].super_BuildRecord.depth._4_4_ * fVar69 +
                 blower1.lower.field_0.m128[1] * fVar73;
        fVar63 = (float)children.children.items[0].super_BuildRecord._8_4_ * fVar69 +
                 blower1.lower.field_0.m128[2] * fVar73;
        fVar64 = (float)children.children.items[0].super_BuildRecord._12_4_ * fVar69 +
                 blower1.lower.field_0.m128[3] * fVar73;
        fVar81 = fVar69 * children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                          super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                          field_0.m128[0] + fVar73 * blower1.upper.field_0.m128[0];
        fVar59 = fVar69 * children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                          super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                          field_0.m128[1] + fVar73 * blower1.upper.field_0.m128[1];
        fVar60 = fVar69 * children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                          super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                          field_0.m128[2] + fVar73 * blower1.upper.field_0.m128[2];
        fVar73 = fVar69 * children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                          super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                          field_0.m128[3] + fVar73 * blower1.upper.field_0.m128[3];
        fVar69 = fVar80 - fVar78;
        if (fVar80 - fVar78 <= 0.0) {
          fVar69 = 0.0;
        }
        fVar78 = 1.0 - fVar69;
        auVar66._0_4_ = (float)values[0].ref.ptr * fVar78 + bupper0.lower.field_0.m128[0] * fVar69;
        auVar66._4_4_ = values[0].ref.ptr._4_4_ * fVar78 + bupper0.lower.field_0.m128[1] * fVar69;
        auVar66._8_4_ = (float)values[0]._8_4_ * fVar78 + bupper0.lower.field_0.m128[2] * fVar69;
        auVar66._12_4_ = (float)values[0]._12_4_ * fVar78 + bupper0.lower.field_0.m128[3] * fVar69;
        auVar55._0_4_ =
             fVar78 * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
             fVar69 * bupper0.upper.field_0.m128[0];
        auVar55._4_4_ =
             fVar78 * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
             fVar69 * bupper0.upper.field_0.m128[1];
        auVar55._8_4_ =
             fVar78 * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
             fVar69 * bupper0.upper.field_0.m128[2];
        auVar55._12_4_ =
             fVar78 * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
             fVar69 * bupper0.upper.field_0.m128[3];
        if (iVar42 < 0) {
          iVar42 = -1;
        }
        sVar29 = (size_t)iVar42;
        while (sVar29 = sVar29 + 1, (long)sVar29 < (long)iVar14) {
          fVar69 = ((float)(int)sVar29 / fVar74 - fVar77) / (fVar79 - fVar77);
          fVar52 = 1.0 - fVar69;
          fVar78 = auVar66._4_4_;
          fVar80 = auVar66._8_4_;
          fVar51 = auVar66._12_4_;
          fVar56 = auVar55._4_4_;
          fVar57 = auVar55._8_4_;
          fVar58 = auVar55._12_4_;
          AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&bi,(anon_class_16_2_4e716a3c *)&right,sVar29);
          auVar47._0_4_ = bi.lower.field_0.m128[0] - (fVar61 * fVar52 + auVar66._0_4_ * fVar69);
          auVar47._4_4_ = bi.lower.field_0.m128[1] - (fVar62 * fVar52 + fVar78 * fVar69);
          auVar47._8_4_ = bi.lower.field_0.m128[2] - (fVar63 * fVar52 + fVar80 * fVar69);
          auVar47._12_4_ = bi.lower.field_0.m128[3] - (fVar64 * fVar52 + fVar51 * fVar69);
          auVar50._0_4_ = bi.upper.field_0.m128[0] - (fVar52 * fVar81 + fVar69 * auVar55._0_4_);
          auVar50._4_4_ = bi.upper.field_0.m128[1] - (fVar52 * fVar59 + fVar69 * fVar56);
          auVar50._8_4_ = bi.upper.field_0.m128[2] - (fVar52 * fVar60 + fVar69 * fVar57);
          auVar50._12_4_ = bi.upper.field_0.m128[3] - (fVar52 * fVar73 + fVar69 * fVar58);
          auVar48 = minps(auVar47,ZEXT816(0));
          auVar72 = maxps(auVar50,ZEXT816(0));
          fVar61 = fVar61 + auVar48._0_4_;
          fVar62 = fVar62 + auVar48._4_4_;
          fVar63 = fVar63 + auVar48._8_4_;
          fVar64 = fVar64 + auVar48._12_4_;
          auVar66._0_4_ = auVar66._0_4_ + auVar48._0_4_;
          auVar66._4_4_ = fVar78 + auVar48._4_4_;
          auVar66._8_4_ = fVar80 + auVar48._8_4_;
          auVar66._12_4_ = fVar51 + auVar48._12_4_;
          fVar81 = fVar81 + auVar72._0_4_;
          fVar59 = fVar59 + auVar72._4_4_;
          fVar60 = fVar60 + auVar72._8_4_;
          fVar73 = fVar73 + auVar72._12_4_;
          auVar55._0_4_ = auVar55._0_4_ + auVar72._0_4_;
          auVar55._4_4_ = fVar56 + auVar72._4_4_;
          auVar55._8_4_ = fVar57 + auVar72._8_4_;
          auVar55._12_4_ = fVar58 + auVar72._12_4_;
        }
      }
      uVar40 = uVar40 + 1;
      auVar13._4_4_ = fVar62;
      auVar13._0_4_ = fVar61;
      auVar13._8_4_ = fVar63;
      auVar13._12_4_ = fVar64;
      aVar49.m128 = (__m128)minps(aVar49.m128,auVar13);
      auVar12._4_4_ = fVar59;
      auVar12._0_4_ = fVar81;
      auVar12._8_4_ = fVar60;
      auVar12._12_4_ = fVar73;
      aVar46.m128 = (__m128)maxps(aVar46.m128,auVar12);
      aVar53.m128 = (__m128)minps(aVar53.m128,auVar66);
      aVar54.m128 = (__m128)maxps(aVar54.m128,auVar55);
    }
    (__return_storage_ptr__->ref).ptr = uVar39 | (ulong)pcVar34 | 8;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = aVar49;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aVar46;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = aVar53;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = aVar54;
    BVar15.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
    BVar15.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
    __return_storage_ptr__->dt = BVar15;
    return __return_storage_ptr__;
  }
  array_t<embree::sse2::BVHBuilderMSMBlur::BuildRecordSplit,_16UL>::array_t(&children.children);
  children.numChildren = 1;
  local_1e40 = 1;
  children.numSharedPrimVecs = 1;
  BuildRecordSplit::operator=((BuildRecordSplit *)&children,&current);
  children.sharedPrimVecs.items[0].prims = current.super_BuildRecord.prims.prims;
  children.sharedPrimVecs.items[0].refCount = 2;
  children.primvecs.items[0] = children.sharedPrimVecs.items;
  bVar17 = false;
  local_1e18._8_8_ = 0x7f8000007f800000;
  local_1e18._0_8_ = 0x7f8000007f800000;
  local_1e28._8_8_ = 0xff800000ff800000;
  local_1e28._0_8_ = 0xff800000ff800000;
  do {
    prVar32 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.object_range;
    uVar38 = 0;
    sVar29 = 0xffffffffffffffff;
    for (sVar37 = 0; children.numChildren != sVar37; sVar37 = sVar37 + 1) {
      uVar39 = prVar32->_end - prVar32->_begin;
      if ((((this->cfg).maxLeafSize < uVar39) || (1 < *(uint *)((long)(prVar32 + 4) + 0xc))) ||
         (bVar44)) {
        if (uVar38 < uVar39) {
          sVar29 = sVar37;
          uVar38 = uVar39;
        }
        bVar44 = false;
      }
      prVar32 = prVar32 + 0xf;
    }
    if (sVar29 == 0xffffffffffffffff) break;
    lVar22 = sVar29 * 0xf0;
    this_00 = &children.children.items[sVar29].super_BuildRecord;
    blower1.lower.field_0._0_8_ = current.super_BuildRecord.depth + 1;
    uVar4 = *(uint *)((long)values + lVar22 + -0x10d4);
    bupper0.lower.field_0._0_8_ = blower1.lower.field_0._0_8_;
    if (3 < uVar4) goto LAB_004d49f2;
    this_01 = &children.children.items[sVar29].super_BuildRecord.prims;
    switch(uVar4) {
    case 0:
      bi.lower.field_0._0_8_ = 0x7f8000007f800000;
      bi.lower.field_0._8_8_ = 0x7f8000007f800000;
      bi.upper.field_0._0_8_ = 0xff800000ff800000;
      bi.upper.field_0._8_8_ = 0xff800000ff800000;
      local_1da8._0_8_ = 0x7f8000007f800000;
      local_1da8._8_8_ = 0x7f8000007f800000;
      local_1d98[0]._0_8_ = 0xff800000ff800000;
      local_1d98[0]._8_8_ = 0xff800000ff800000;
      isLeft.split = (Split *)((long)values + lVar22 + -0x10e0);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.max_time_range.lower = 0.0;
      right.max_time_range.upper = 1.0;
      right.time_range.lower = 1.0;
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = *(undefined4 *)((long)values + lVar22 + -0x10d8);
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar27 = (long)(1 << (*(byte *)((long)values + lVar22 + -0x10dc) & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar27);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar27 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                (*(PrimRefMB **)(*(long *)((long)values + lVar22 + -0x10f0) + 0x20),
                 children.children.items[sVar29].super_BuildRecord.prims.super_PrimInfoMB.
                 object_range._begin,
                 children.children.items[sVar29].super_BuildRecord.prims.super_PrimInfoMB.
                 object_range._end,(EmptyTy *)local_1c88,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi,&right,&isLeft,&reduction,
                 &reduction2,0x80,0xc00);
      local_1bd8 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                     **)((long)values + lVar22 + -0x10f0);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&blower1.upper,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi);
      local_19c8 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                     **)((long)values + lVar22 + -0x10f0);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bupper0.upper,&right);
      break;
    case 1:
      SetMB::deterministic_order(this_01);
      splitFallback(this,this_01,(SetMB *)&blower1.upper,(SetMB *)&bupper0.upper);
      break;
    case 2:
      time_range1.lower = *(float *)((long)values + lVar22 + -0x10d8);
      time_range0.lower = *(float *)((long)values + lVar22 + -0x10f8);
      time_range1.upper = *(float *)((long)values + lVar22 + -0x10f4);
      pmVar8 = *(mvector<embree::PrimRefMB> **)((long)values + lVar22 + -0x10f0);
      time_range0.upper = time_range1.lower;
      _Var23.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )::operator_new(0x28);
      pMVar7 = (this->heuristicTemporalSplit).device;
      *(long *)((long)_Var23.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x20) = 0;
      pSVar33 = (Split *)children.children.items[sVar29].super_BuildRecord.prims.super_PrimInfoMB.
                         object_range._end;
      uVar40 = children.children.items[sVar29].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      *(MemoryMonitorInterface **)
       _Var23.
       super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       .
       super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
       ._M_head_impl = pMVar7;
      *(undefined1 *)
       ((long)_Var23.
              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 8) = 0;
      *(long *)((long)_Var23.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x10) = 0;
      *(long *)((long)_Var23.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x18) = 0;
      lVar22 = (long)pSVar33 - uVar40;
      pSVar43 = pSVar33;
      if (lVar22 != 0) {
        uVar38 = lVar22 * 0x50;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,uVar38,0);
        if (uVar38 < 0x1c00000) {
          pvVar24 = alignedMalloc(uVar38,0x10);
        }
        else {
          pvVar24 = os_malloc(uVar38,(bool *)((long)_Var23.
                                                  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                  ._M_head_impl + 8));
        }
        *(void **)((long)_Var23.
                         super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         .
                         super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                         ._M_head_impl + 0x20) = pvVar24;
        *(long *)((long)_Var23.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x10) = lVar22;
        *(long *)((long)_Var23.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x18) = lVar22;
        pSVar33 = (Split *)children.children.items[sVar29].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._begin;
        pSVar43 = (Split *)children.children.items[sVar29].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._end;
      }
      vSplitMask.field_0._8_8_ = &time_range0;
      bi.lower.field_0._0_8_ = 0x7f8000007f800000;
      bi.lower.field_0._8_8_ = 0x7f8000007f800000;
      bi.upper.field_0._0_8_ = 0xff800000ff800000;
      bi.upper.field_0._8_8_ = 0xff800000ff800000;
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )_Var23.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      lprims = (PrimRefVector)
               _Var23.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      vSplitMask.field_0._0_8_ = pmVar8;
      if ((ulong)((long)pSVar43 - (long)pSVar33) < 0xc00) {
        isLeft.split = pSVar33;
        isLeft.vSplitPos = (vint *)pSVar43;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  (&right,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)pSVar43;
        vSplitPos.field_0.v[1] = (longlong)pSVar33;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&bi,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,(task_group_context *)this_00);
        cVar21 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar21 != '\0') {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar26,"task cancelled");
          __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
      }
      uVar40 = children.children.items[sVar29].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end - children.children.items[sVar29].super_BuildRecord.prims.super_PrimInfoMB.
                       object_range._begin;
      if (right.object_range._end - right.object_range._begin != uVar40) {
        bi.lower.field_0._0_8_ = &time_range0;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                       (lprims->items,0,uVar40,0x400,(anon_class_8_1_41ce32a5 *)&bi);
      }
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi,&right);
      SetMB::operator=((SetMB *)&blower1.upper,(SetMB *)&bi);
      uVar40 = children.children.items[sVar29].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      bi.lower.field_0._0_8_ = 0x7f8000007f800000;
      bi.lower.field_0._8_8_ = 0x7f8000007f800000;
      bi.upper.field_0._0_8_ = 0xff800000ff800000;
      bi.upper.field_0._8_8_ = 0xff800000ff800000;
      local_1da8._0_8_ = 0x7f8000007f800000;
      local_1da8._8_8_ = 0x7f8000007f800000;
      local_1d98[0]._0_8_ = 0xff800000ff800000;
      local_1d98[0]._8_8_ = 0xff800000ff800000;
      pcVar9 = (code *)children.children.items[sVar29].super_BuildRecord.prims.super_PrimInfoMB.
                       object_range._end;
      _reduction2 = pmVar8;
      if ((long)pcVar9 - uVar40 < 0xc00) {
        vSplitPos.field_0.v[0] = uVar40;
        vSplitPos.field_0.v[1] = (longlong)pcVar9;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&isLeft,(anon_class_24_3_35f68c7c *)&reduction2,
                   (range<unsigned_long> *)&vSplitPos);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&vSplitPos,(context_traits)0x4,CUSTOM_CTX);
        local_1c88._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1c88._8_8_ = &reduction2;
        _reduction = pcVar9;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft,(d1 *)&reduction,
                   (blocked_range<unsigned_long> *)&bi,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1c88,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,(task_group_context *)this_00);
        cVar21 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar21 != '\0') {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar26,"task cancelled");
          __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos);
      }
      lVar22 = local_1a90 - local_1a98;
      local_1a98 = children.children.items[sVar29].super_BuildRecord.prims.super_PrimInfoMB.
                   object_range._begin;
      local_1a90 = lVar22 + local_1a98;
      uVar40 = children.children.items[sVar29].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end;
      if (lVar22 != uVar40 - local_1a98) {
        bi.lower.field_0._0_8_ = &time_range1;
        local_1a90 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (pmVar8->items,local_1a98,uVar40,0x400,(anon_class_8_1_41ce32a6 *)&bi
                               );
      }
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&bi,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft);
      SetMB::operator=((SetMB *)&bupper0.upper,(SetMB *)&bi);
      bVar45 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      goto LAB_004d4a02;
    case 3:
      SetMB::deterministic_order(this_01);
      splitByGeometry(this,this_01,(SetMB *)&blower1.upper,(SetMB *)&bupper0.upper);
    }
LAB_004d49f2:
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    bVar45 = false;
LAB_004d4a02:
    findFallback((Split *)&bi,this,(SetMB *)&blower1.upper);
    findFallback((Split *)&bi,this,(SetMB *)&bupper0.upper);
    sVar37 = children.numSharedPrimVecs;
    local_1dd8._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    pSVar5 = children.primvecs.items[sVar29];
    if (local_1bd8 == pSVar5->prims) {
      pSVar5->refCount = pSVar5->refCount + 1;
      pvVar28 = local_1bd8;
    }
    else {
      pSVar18 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar19 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar19->prims = local_1bd8;
      children.sharedPrimVecs.items[sVar37].refCount = 1;
      children.primvecs.items[sVar29] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar18->prims;
      pvVar28 = pSVar5->prims;
    }
    sVar29 = children.numSharedPrimVecs;
    if (local_19c8 == pvVar28) {
      children.primvecs.items[children.numChildren] = pSVar5;
      sVar29 = pSVar5->refCount;
      pSVar5->refCount = sVar29 + 1;
    }
    else {
      pSVar18 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar19 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar19->prims = local_19c8;
      children.sharedPrimVecs.items[sVar29].refCount = 1;
      children.primvecs.items[children.numChildren] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar18->prims;
      sVar29 = pSVar5->refCount - 1;
    }
    pSVar5->refCount = sVar29;
    if (sVar29 == 0) {
      pvVar28 = pSVar5->prims;
      if (pvVar28 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar29 = pvVar28->size_alloced;
        pPVar6 = pvVar28->items;
        if (pPVar6 != (PrimRefMB *)0x0) {
          if (sVar29 * 0x50 < 0x1c00000) {
            alignedFree(pPVar6);
          }
          else {
            os_free(pPVar6,sVar29 * 0x50,(pvVar28->alloc).hugepages);
          }
        }
        if (sVar29 != 0) {
          pMVar7 = (pvVar28->alloc).device;
          (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar29 * -0x50,1);
        }
        pvVar28->size_active = 0;
        pvVar28->size_alloced = 0;
        pvVar28->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar28);
    }
    local_1dd8._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecordSplit::operator=((BuildRecordSplit *)this_00,(BuildRecordSplit *)&blower1);
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&children.children.items[children.numChildren].super_BuildRecord,
               (BuildRecordSplit *)&bupper0);
    bVar17 = (bool)(bVar17 | bVar45);
    children.numChildren = children.numChildren + 1;
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_1dd8);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr(&new_vector);
  } while (children.numChildren < (this->cfg).branchingFactor);
  in_00 = &children;
  pfVar30 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  sVar29 = children.numChildren;
  while (bVar44 = sVar29 != 0, sVar29 = sVar29 - 1, bVar44) {
    bVar17 = (bool)(bVar17 | (*pfVar30 < (in->prims).super_PrimInfoMB.time_range.upper ||
                             (in->prims).super_PrimInfoMB.time_range.lower <
                             ((BBox1f *)(pfVar30 + -1))->lower));
    pfVar30 = pfVar30 + 0x3c;
  }
  if (!bVar17) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar10 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
      bupper0.lower.field_0._8_1_ = 1;
      bupper0.lower.field_0._0_8_ = pTVar10;
      MutexSys::lock(&pTVar10->mutex);
      if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
             ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar10->alloc0).bytesUsed = 0;
      (pTVar10->alloc0).bytesWasted = 0;
      (pTVar10->alloc0).end = 0;
      (pTVar10->alloc0).allocBlockSize = 0;
      (pTVar10->alloc0).ptr = (char *)0x0;
      (pTVar10->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
      }
      else {
        (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar10->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      blower1.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      blower1.lower.field_0._8_1_ = 1;
      bi.lower.field_0._0_8_ = pTVar10;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&bi);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&blower1);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&bupper0);
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar29 = (alloc.talloc0)->cur;
    uVar38 = (ulong)(-(int)sVar29 & 0xf);
    uVar39 = sVar29 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar38;
    (alloc.talloc0)->cur = uVar39;
    if ((alloc.talloc0)->end < uVar39) {
      (alloc.talloc0)->cur = sVar29;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
        (alloc.talloc0)->ptr = pcVar34;
        sVar29 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar29;
        (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)blower1.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
          (alloc.talloc0)->ptr = pcVar34;
          sVar29 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar29;
          (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)blower1.lower.field_0._0_8_ <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar34 = (char *)0x0;
            goto LAB_004d5761;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar29;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar38;
      pcVar34 = (alloc.talloc0)->ptr +
                (uVar39 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_004d5761:
    pcVar34[0x60] = '\0';
    pcVar34[0x61] = '\0';
    pcVar34[0x62] = -0x80;
    pcVar34[99] = '\x7f';
    pcVar34[100] = '\0';
    pcVar34[0x65] = '\0';
    pcVar34[0x66] = -0x80;
    pcVar34[0x67] = '\x7f';
    pcVar34[0x68] = '\0';
    pcVar34[0x69] = '\0';
    pcVar34[0x6a] = -0x80;
    pcVar34[0x6b] = '\x7f';
    pcVar34[0x6c] = '\0';
    pcVar34[0x6d] = '\0';
    pcVar34[0x6e] = -0x80;
    pcVar34[0x6f] = '\x7f';
    pcVar34[0x40] = '\0';
    pcVar34[0x41] = '\0';
    pcVar34[0x42] = -0x80;
    pcVar34[0x43] = '\x7f';
    pcVar34[0x44] = '\0';
    pcVar34[0x45] = '\0';
    pcVar34[0x46] = -0x80;
    pcVar34[0x47] = '\x7f';
    pcVar34[0x48] = '\0';
    pcVar34[0x49] = '\0';
    pcVar34[0x4a] = -0x80;
    pcVar34[0x4b] = '\x7f';
    pcVar34[0x4c] = '\0';
    pcVar34[0x4d] = '\0';
    pcVar34[0x4e] = -0x80;
    pcVar34[0x4f] = '\x7f';
    pcVar34[0x20] = '\0';
    pcVar34[0x21] = '\0';
    pcVar34[0x22] = -0x80;
    pcVar34[0x23] = '\x7f';
    pcVar34[0x24] = '\0';
    pcVar34[0x25] = '\0';
    pcVar34[0x26] = -0x80;
    pcVar34[0x27] = '\x7f';
    pcVar34[0x28] = '\0';
    pcVar34[0x29] = '\0';
    pcVar34[0x2a] = -0x80;
    pcVar34[0x2b] = '\x7f';
    pcVar34[0x2c] = '\0';
    pcVar34[0x2d] = '\0';
    pcVar34[0x2e] = -0x80;
    pcVar34[0x2f] = '\x7f';
    pcVar34[0x70] = '\0';
    pcVar34[0x71] = '\0';
    pcVar34[0x72] = -0x80;
    pcVar34[0x73] = -1;
    pcVar34[0x74] = '\0';
    pcVar34[0x75] = '\0';
    pcVar34[0x76] = -0x80;
    pcVar34[0x77] = -1;
    pcVar34[0x78] = '\0';
    pcVar34[0x79] = '\0';
    pcVar34[0x7a] = -0x80;
    pcVar34[0x7b] = -1;
    pcVar34[0x7c] = '\0';
    pcVar34[0x7d] = '\0';
    pcVar34[0x7e] = -0x80;
    pcVar34[0x7f] = -1;
    pcVar34[0x50] = '\0';
    pcVar34[0x51] = '\0';
    pcVar34[0x52] = -0x80;
    pcVar34[0x53] = -1;
    pcVar34[0x54] = '\0';
    pcVar34[0x55] = '\0';
    pcVar34[0x56] = -0x80;
    pcVar34[0x57] = -1;
    pcVar34[0x58] = '\0';
    pcVar34[0x59] = '\0';
    pcVar34[0x5a] = -0x80;
    pcVar34[0x5b] = -1;
    pcVar34[0x5c] = '\0';
    pcVar34[0x5d] = '\0';
    pcVar34[0x5e] = -0x80;
    pcVar34[0x5f] = -1;
    pcVar34[0x30] = '\0';
    pcVar34[0x31] = '\0';
    pcVar34[0x32] = -0x80;
    pcVar34[0x33] = -1;
    pcVar34[0x34] = '\0';
    pcVar34[0x35] = '\0';
    pcVar34[0x36] = -0x80;
    pcVar34[0x37] = -1;
    pcVar34[0x38] = '\0';
    pcVar34[0x39] = '\0';
    pcVar34[0x3a] = -0x80;
    pcVar34[0x3b] = -1;
    pcVar34[0x3c] = '\0';
    pcVar34[0x3d] = '\0';
    pcVar34[0x3e] = -0x80;
    pcVar34[0x3f] = -1;
    pcVar34[0x80] = '\0';
    pcVar34[0x81] = '\0';
    pcVar34[0x82] = '\0';
    pcVar34[0x83] = '\0';
    pcVar34[0x84] = '\0';
    pcVar34[0x85] = '\0';
    pcVar34[0x86] = '\0';
    pcVar34[0x87] = '\0';
    pcVar34[0x88] = '\0';
    pcVar34[0x89] = '\0';
    pcVar34[0x8a] = '\0';
    pcVar34[0x8b] = '\0';
    pcVar34[0x8c] = '\0';
    pcVar34[0x8d] = '\0';
    pcVar34[0x8e] = '\0';
    pcVar34[0x8f] = '\0';
    pcVar34[0x90] = '\0';
    pcVar34[0x91] = '\0';
    pcVar34[0x92] = '\0';
    pcVar34[0x93] = '\0';
    pcVar34[0x94] = '\0';
    pcVar34[0x95] = '\0';
    pcVar34[0x96] = '\0';
    pcVar34[0x97] = '\0';
    pcVar34[0x98] = '\0';
    pcVar34[0x99] = '\0';
    pcVar34[0x9a] = '\0';
    pcVar34[0x9b] = '\0';
    pcVar34[0x9c] = '\0';
    pcVar34[0x9d] = '\0';
    pcVar34[0x9e] = '\0';
    pcVar34[0x9f] = '\0';
    pcVar34[0xa0] = '\0';
    pcVar34[0xa1] = '\0';
    pcVar34[0xa2] = '\0';
    pcVar34[0xa3] = '\0';
    pcVar34[0xa4] = '\0';
    pcVar34[0xa5] = '\0';
    pcVar34[0xa6] = '\0';
    pcVar34[0xa7] = '\0';
    pcVar34[0xa8] = '\0';
    pcVar34[0xa9] = '\0';
    pcVar34[0xaa] = '\0';
    pcVar34[0xab] = '\0';
    pcVar34[0xac] = '\0';
    pcVar34[0xad] = '\0';
    pcVar34[0xae] = '\0';
    pcVar34[0xaf] = '\0';
    pcVar34[0xb0] = '\0';
    pcVar34[0xb1] = '\0';
    pcVar34[0xb2] = '\0';
    pcVar34[0xb3] = '\0';
    pcVar34[0xb4] = '\0';
    pcVar34[0xb5] = '\0';
    pcVar34[0xb6] = '\0';
    pcVar34[0xb7] = '\0';
    pcVar34[0xb8] = '\0';
    pcVar34[0xb9] = '\0';
    pcVar34[0xba] = '\0';
    pcVar34[0xbb] = '\0';
    pcVar34[0xbc] = '\0';
    pcVar34[0xbd] = '\0';
    pcVar34[0xbe] = '\0';
    pcVar34[0xbf] = '\0';
    pcVar34[0xc0] = '\0';
    pcVar34[0xc1] = '\0';
    pcVar34[0xc2] = '\0';
    pcVar34[0xc3] = '\0';
    pcVar34[0xc4] = '\0';
    pcVar34[0xc5] = '\0';
    pcVar34[0xc6] = '\0';
    pcVar34[199] = '\0';
    pcVar34[200] = '\0';
    pcVar34[0xc9] = '\0';
    pcVar34[0xca] = '\0';
    pcVar34[0xcb] = '\0';
    pcVar34[0xcc] = '\0';
    pcVar34[0xcd] = '\0';
    pcVar34[0xce] = '\0';
    pcVar34[0xcf] = '\0';
    pcVar34[0xd0] = '\0';
    pcVar34[0xd1] = '\0';
    pcVar34[0xd2] = '\0';
    pcVar34[0xd3] = '\0';
    pcVar34[0xd4] = '\0';
    pcVar34[0xd5] = '\0';
    pcVar34[0xd6] = '\0';
    pcVar34[0xd7] = '\0';
    pcVar34[0xd8] = '\0';
    pcVar34[0xd9] = '\0';
    pcVar34[0xda] = '\0';
    pcVar34[0xdb] = '\0';
    pcVar34[0xdc] = '\0';
    pcVar34[0xdd] = '\0';
    pcVar34[0xde] = '\0';
    pcVar34[0xdf] = '\0';
    for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
      pcVar3 = pcVar34 + lVar22 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
    }
    goto LAB_004d57c9;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar10 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
    bupper0.lower.field_0._8_1_ = 1;
    bupper0.lower.field_0._0_8_ = pTVar10;
    MutexSys::lock(&pTVar10->mutex);
    if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
           ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar10->alloc0).bytesUsed = 0;
    (pTVar10->alloc0).bytesWasted = 0;
    (pTVar10->alloc0).end = 0;
    (pTVar10->alloc0).allocBlockSize = 0;
    (pTVar10->alloc0).ptr = (char *)0x0;
    (pTVar10->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar10->alloc1).bytesUsed = 0;
      (pTVar10->alloc1).bytesWasted = 0;
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
      (pTVar10->alloc1).ptr = (char *)0x0;
      (pTVar10->alloc1).cur = 0;
    }
    else {
      (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar10->alloc1).ptr = (char *)0x0;
      (pTVar10->alloc1).cur = 0;
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
      (pTVar10->alloc1).bytesUsed = 0;
      (pTVar10->alloc1).bytesWasted = 0;
      (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar10->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    blower1.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    blower1.lower.field_0._8_1_ = 1;
    bi.lower.field_0._0_8_ = pTVar10;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&bi);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&blower1);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&bupper0);
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar29 = (alloc.talloc0)->cur;
  uVar38 = (ulong)(-(int)sVar29 & 0xf);
  uVar39 = sVar29 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar38;
  (alloc.talloc0)->cur = uVar39;
  if ((alloc.talloc0)->end < uVar39) {
    (alloc.talloc0)->cur = sVar29;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
      (alloc.talloc0)->ptr = pcVar34;
      sVar29 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar29;
      (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)blower1.lower.field_0._0_8_ <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        blower1.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar34 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&blower1);
        (alloc.talloc0)->ptr = pcVar34;
        sVar29 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar29;
        (alloc.talloc0)->end = blower1.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)blower1.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar34 = (char *)0x0;
          goto LAB_004d563a;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar29;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar38;
    pcVar34 = (alloc.talloc0)->ptr +
              (uVar39 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_004d563a:
  pcVar34[0xe0] = '\0';
  pcVar34[0xe1] = '\0';
  pcVar34[0xe2] = -0x80;
  pcVar34[0xe3] = '\x7f';
  pcVar34[0xe4] = '\0';
  pcVar34[0xe5] = '\0';
  pcVar34[0xe6] = -0x80;
  pcVar34[0xe7] = '\x7f';
  pcVar34[0xe8] = '\0';
  pcVar34[0xe9] = '\0';
  pcVar34[0xea] = -0x80;
  pcVar34[0xeb] = '\x7f';
  pcVar34[0xec] = '\0';
  pcVar34[0xed] = '\0';
  pcVar34[0xee] = -0x80;
  pcVar34[0xef] = '\x7f';
  pcVar34[0xf0] = '\0';
  pcVar34[0xf1] = '\0';
  pcVar34[0xf2] = -0x80;
  pcVar34[0xf3] = -1;
  pcVar34[0xf4] = '\0';
  pcVar34[0xf5] = '\0';
  pcVar34[0xf6] = -0x80;
  pcVar34[0xf7] = -1;
  pcVar34[0xf8] = '\0';
  pcVar34[0xf9] = '\0';
  pcVar34[0xfa] = -0x80;
  pcVar34[0xfb] = -1;
  pcVar34[0xfc] = '\0';
  pcVar34[0xfd] = '\0';
  pcVar34[0xfe] = -0x80;
  pcVar34[0xff] = -1;
  pcVar34[0x60] = '\0';
  pcVar34[0x61] = '\0';
  pcVar34[0x62] = -0x80;
  pcVar34[99] = '\x7f';
  pcVar34[100] = '\0';
  pcVar34[0x65] = '\0';
  pcVar34[0x66] = -0x80;
  pcVar34[0x67] = '\x7f';
  pcVar34[0x68] = '\0';
  pcVar34[0x69] = '\0';
  pcVar34[0x6a] = -0x80;
  pcVar34[0x6b] = '\x7f';
  pcVar34[0x6c] = '\0';
  pcVar34[0x6d] = '\0';
  pcVar34[0x6e] = -0x80;
  pcVar34[0x6f] = '\x7f';
  pcVar34[0x40] = '\0';
  pcVar34[0x41] = '\0';
  pcVar34[0x42] = -0x80;
  pcVar34[0x43] = '\x7f';
  pcVar34[0x44] = '\0';
  pcVar34[0x45] = '\0';
  pcVar34[0x46] = -0x80;
  pcVar34[0x47] = '\x7f';
  pcVar34[0x48] = '\0';
  pcVar34[0x49] = '\0';
  pcVar34[0x4a] = -0x80;
  pcVar34[0x4b] = '\x7f';
  pcVar34[0x4c] = '\0';
  pcVar34[0x4d] = '\0';
  pcVar34[0x4e] = -0x80;
  pcVar34[0x4f] = '\x7f';
  pcVar34[0x20] = '\0';
  pcVar34[0x21] = '\0';
  pcVar34[0x22] = -0x80;
  pcVar34[0x23] = '\x7f';
  pcVar34[0x24] = '\0';
  pcVar34[0x25] = '\0';
  pcVar34[0x26] = -0x80;
  pcVar34[0x27] = '\x7f';
  pcVar34[0x28] = '\0';
  pcVar34[0x29] = '\0';
  pcVar34[0x2a] = -0x80;
  pcVar34[0x2b] = '\x7f';
  pcVar34[0x2c] = '\0';
  pcVar34[0x2d] = '\0';
  pcVar34[0x2e] = -0x80;
  pcVar34[0x2f] = '\x7f';
  pcVar34[0x70] = '\0';
  pcVar34[0x71] = '\0';
  pcVar34[0x72] = -0x80;
  pcVar34[0x73] = -1;
  pcVar34[0x74] = '\0';
  pcVar34[0x75] = '\0';
  pcVar34[0x76] = -0x80;
  pcVar34[0x77] = -1;
  pcVar34[0x78] = '\0';
  pcVar34[0x79] = '\0';
  pcVar34[0x7a] = -0x80;
  pcVar34[0x7b] = -1;
  pcVar34[0x7c] = '\0';
  pcVar34[0x7d] = '\0';
  pcVar34[0x7e] = -0x80;
  pcVar34[0x7f] = -1;
  pcVar34[0x50] = '\0';
  pcVar34[0x51] = '\0';
  pcVar34[0x52] = -0x80;
  pcVar34[0x53] = -1;
  pcVar34[0x54] = '\0';
  pcVar34[0x55] = '\0';
  pcVar34[0x56] = -0x80;
  pcVar34[0x57] = -1;
  pcVar34[0x58] = '\0';
  pcVar34[0x59] = '\0';
  pcVar34[0x5a] = -0x80;
  pcVar34[0x5b] = -1;
  pcVar34[0x5c] = '\0';
  pcVar34[0x5d] = '\0';
  pcVar34[0x5e] = -0x80;
  pcVar34[0x5f] = -1;
  pcVar34[0x30] = '\0';
  pcVar34[0x31] = '\0';
  pcVar34[0x32] = -0x80;
  pcVar34[0x33] = -1;
  pcVar34[0x34] = '\0';
  pcVar34[0x35] = '\0';
  pcVar34[0x36] = -0x80;
  pcVar34[0x37] = -1;
  pcVar34[0x38] = '\0';
  pcVar34[0x39] = '\0';
  pcVar34[0x3a] = -0x80;
  pcVar34[0x3b] = -1;
  pcVar34[0x3c] = '\0';
  pcVar34[0x3d] = '\0';
  pcVar34[0x3e] = -0x80;
  pcVar34[0x3f] = -1;
  pcVar34[0x80] = '\0';
  pcVar34[0x81] = '\0';
  pcVar34[0x82] = '\0';
  pcVar34[0x83] = '\0';
  pcVar34[0x84] = '\0';
  pcVar34[0x85] = '\0';
  pcVar34[0x86] = '\0';
  pcVar34[0x87] = '\0';
  pcVar34[0x88] = '\0';
  pcVar34[0x89] = '\0';
  pcVar34[0x8a] = '\0';
  pcVar34[0x8b] = '\0';
  pcVar34[0x8c] = '\0';
  pcVar34[0x8d] = '\0';
  pcVar34[0x8e] = '\0';
  pcVar34[0x8f] = '\0';
  pcVar34[0x90] = '\0';
  pcVar34[0x91] = '\0';
  pcVar34[0x92] = '\0';
  pcVar34[0x93] = '\0';
  pcVar34[0x94] = '\0';
  pcVar34[0x95] = '\0';
  pcVar34[0x96] = '\0';
  pcVar34[0x97] = '\0';
  pcVar34[0x98] = '\0';
  pcVar34[0x99] = '\0';
  pcVar34[0x9a] = '\0';
  pcVar34[0x9b] = '\0';
  pcVar34[0x9c] = '\0';
  pcVar34[0x9d] = '\0';
  pcVar34[0x9e] = '\0';
  pcVar34[0x9f] = '\0';
  pcVar34[0xa0] = '\0';
  pcVar34[0xa1] = '\0';
  pcVar34[0xa2] = '\0';
  pcVar34[0xa3] = '\0';
  pcVar34[0xa4] = '\0';
  pcVar34[0xa5] = '\0';
  pcVar34[0xa6] = '\0';
  pcVar34[0xa7] = '\0';
  pcVar34[0xa8] = '\0';
  pcVar34[0xa9] = '\0';
  pcVar34[0xaa] = '\0';
  pcVar34[0xab] = '\0';
  pcVar34[0xac] = '\0';
  pcVar34[0xad] = '\0';
  pcVar34[0xae] = '\0';
  pcVar34[0xaf] = '\0';
  pcVar34[0xb0] = '\0';
  pcVar34[0xb1] = '\0';
  pcVar34[0xb2] = '\0';
  pcVar34[0xb3] = '\0';
  pcVar34[0xb4] = '\0';
  pcVar34[0xb5] = '\0';
  pcVar34[0xb6] = '\0';
  pcVar34[0xb7] = '\0';
  pcVar34[0xb8] = '\0';
  pcVar34[0xb9] = '\0';
  pcVar34[0xba] = '\0';
  pcVar34[0xbb] = '\0';
  pcVar34[0xbc] = '\0';
  pcVar34[0xbd] = '\0';
  pcVar34[0xbe] = '\0';
  pcVar34[0xbf] = '\0';
  pcVar34[0xc0] = '\0';
  pcVar34[0xc1] = '\0';
  pcVar34[0xc2] = '\0';
  pcVar34[0xc3] = '\0';
  pcVar34[0xc4] = '\0';
  pcVar34[0xc5] = '\0';
  pcVar34[0xc6] = '\0';
  pcVar34[199] = '\0';
  pcVar34[200] = '\0';
  pcVar34[0xc9] = '\0';
  pcVar34[0xca] = '\0';
  pcVar34[0xcb] = '\0';
  pcVar34[0xcc] = '\0';
  pcVar34[0xcd] = '\0';
  pcVar34[0xce] = '\0';
  pcVar34[0xcf] = '\0';
  pcVar34[0xd0] = '\0';
  pcVar34[0xd1] = '\0';
  pcVar34[0xd2] = '\0';
  pcVar34[0xd3] = '\0';
  pcVar34[0xd4] = '\0';
  pcVar34[0xd5] = '\0';
  pcVar34[0xd6] = '\0';
  pcVar34[0xd7] = '\0';
  pcVar34[0xd8] = '\0';
  pcVar34[0xd9] = '\0';
  pcVar34[0xda] = '\0';
  pcVar34[0xdb] = '\0';
  pcVar34[0xdc] = '\0';
  pcVar34[0xdd] = '\0';
  pcVar34[0xde] = '\0';
  pcVar34[0xdf] = '\0';
  local_1e40 = 6;
  for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
    pcVar3 = pcVar34 + lVar22 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
  }
LAB_004d57c9:
  local_1e40 = local_1e40 | (ulong)pcVar34;
  pBVar41 = &values[0].dt;
  uStack_1e60 = 0xff800000ff800000;
  local_1e68._0_8_ = (task_group_context *)0xff800000ff800000;
  local_1e58._8_8_ = 0x7f8000007f800000;
  local_1e58._0_8_ = 0x7f8000007f800000;
  for (uVar38 = 0; auVar72 = _DAT_01f4b860, auVar48 = _DAT_01f4b850, uVar38 < children.numChildren;
      uVar38 = uVar38 + 1) {
    createLargeLeaf((NodeRecordMB4D *)&blower1,this,(BuildRecord *)in_00,alloc);
    pBVar41[-10].lower = (float)blower1.lower.field_0._0_4_;
    pBVar41[-10].upper = (float)blower1.lower.field_0._4_4_;
    auVar48._4_4_ = blower1.upper.field_0.m128[1];
    auVar48._0_4_ = blower1.upper.field_0.m128[0];
    auVar48._8_4_ = blower1.upper.field_0.m128[2];
    auVar48._12_4_ = blower1.upper.field_0.m128[3];
    *(undefined1 (*) [16])(pBVar41 + -8) = auVar48;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar41 + -6) = local_1c58;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar41 + -4) = local_1c48;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar41 + -2) = local_1c38;
    pBVar41->lower = (float)local_1c28;
    pBVar41->upper = (float)uStack_1c24;
    local_1e58 = minps(local_1e58,auVar48);
    local_1e68 = maxps(local_1e68,(undefined1  [16])local_1c58);
    local_1e18 = minps(local_1e18,(undefined1  [16])local_1c48);
    local_1e28 = maxps(local_1e28,(undefined1  [16])local_1c38);
    in_00 = (LocalChildListSplit *)((in_00->children).items + 1);
    pBVar41 = pBVar41 + 0xc;
  }
  uVar38 = (ulong)pcVar34 & 0xfffffffffffffff0;
  if (((uint)local_1e40 & 0xf) == 1) {
    pfVar30 = &values[0].dt.upper;
    for (sVar29 = 0; children.numChildren != sVar29; sVar29 = sVar29 + 1) {
      *(undefined8 *)(uVar38 + sVar29 * 8) = *(undefined8 *)(pfVar30 + -0x15);
      fVar74 = ((BBox1f *)(pfVar30 + -1))->lower;
      fVar73 = 1.0 / (*pfVar30 - fVar74);
      fVar79 = -fVar74 * fVar73;
      fVar69 = 1.0 - fVar79;
      auVar67._0_4_ = pfVar30[-0x11] * fVar69 + pfVar30[-9] * fVar79;
      auVar67._4_4_ = pfVar30[-0x10] * fVar69 + pfVar30[-8] * fVar79;
      auVar67._8_4_ = pfVar30[-0xf] * fVar69 + pfVar30[-7] * fVar79;
      auVar67._12_4_ = pfVar30[-0xe] * fVar69 + pfVar30[-6] * fVar79;
      auVar70._0_4_ = fVar69 * pfVar30[-0xd] + fVar79 * pfVar30[-5];
      auVar70._4_4_ = fVar69 * pfVar30[-0xc] + fVar79 * pfVar30[-4];
      auVar70._8_4_ = fVar69 * pfVar30[-0xb] + fVar79 * pfVar30[-3];
      auVar70._12_4_ = fVar69 * pfVar30[-10] + fVar79 * pfVar30[-2];
      fVar73 = (1.0 - fVar74) * fVar73;
      fVar74 = 1.0 - fVar73;
      auVar76._0_4_ = pfVar30[-0x11] * fVar74 + pfVar30[-9] * fVar73;
      auVar76._4_4_ = pfVar30[-0x10] * fVar74 + pfVar30[-8] * fVar73;
      auVar76._8_4_ = pfVar30[-0xf] * fVar74 + pfVar30[-7] * fVar73;
      auVar76._12_4_ = pfVar30[-0xe] * fVar74 + pfVar30[-6] * fVar73;
      auVar75._0_4_ = fVar74 * pfVar30[-0xd] + fVar73 * pfVar30[-5];
      auVar75._4_4_ = fVar74 * pfVar30[-0xc] + fVar73 * pfVar30[-4];
      auVar75._8_4_ = fVar74 * pfVar30[-0xb] + fVar73 * pfVar30[-3];
      auVar75._12_4_ = fVar74 * pfVar30[-10] + fVar73 * pfVar30[-2];
      auVar68 = minps(auVar67,auVar72);
      auVar71 = maxps(auVar70,auVar48);
      auVar65 = minps(auVar76,auVar72);
      auVar76 = maxps(auVar75,auVar48);
      fVar74 = auVar68._0_4_ - ABS(auVar68._0_4_) * 4.7683716e-07;
      fVar69 = auVar68._4_4_ - ABS(auVar68._4_4_) * 4.7683716e-07;
      fVar73 = auVar68._8_4_ - ABS(auVar68._8_4_) * 4.7683716e-07;
      fVar79 = ABS(auVar71._0_4_) * 4.7683716e-07 + auVar71._0_4_;
      fVar77 = ABS(auVar71._4_4_) * 4.7683716e-07 + auVar71._4_4_;
      fVar78 = ABS(auVar71._8_4_) * 4.7683716e-07 + auVar71._8_4_;
      *(float *)(uVar38 + 0x20 + sVar29 * 4) = fVar74;
      *(float *)(uVar38 + 0x40 + sVar29 * 4) = fVar69;
      *(float *)(uVar38 + 0x60 + sVar29 * 4) = fVar73;
      *(float *)(uVar38 + 0x30 + sVar29 * 4) = fVar79;
      *(float *)(uVar38 + 0x50 + sVar29 * 4) = fVar77;
      *(float *)(uVar38 + 0x70 + sVar29 * 4) = fVar78;
      *(float *)(uVar38 + 0x80 + sVar29 * 4) =
           (auVar65._0_4_ - ABS(auVar65._0_4_) * 4.7683716e-07) - fVar74;
      *(float *)(uVar38 + 0xa0 + sVar29 * 4) =
           (auVar65._4_4_ - ABS(auVar65._4_4_) * 4.7683716e-07) - fVar69;
      *(float *)(uVar38 + 0xc0 + sVar29 * 4) =
           (auVar65._8_4_ - ABS(auVar65._8_4_) * 4.7683716e-07) - fVar73;
      *(float *)(uVar38 + 0x90 + sVar29 * 4) =
           (ABS(auVar76._0_4_) * 4.7683716e-07 + auVar76._0_4_) - fVar79;
      *(float *)(uVar38 + 0xb0 + sVar29 * 4) =
           (ABS(auVar76._4_4_) * 4.7683716e-07 + auVar76._4_4_) - fVar77;
      *(float *)(uVar38 + 0xd0 + sVar29 * 4) =
           (ABS(auVar76._8_4_) * 4.7683716e-07 + auVar76._8_4_) - fVar78;
      pfVar30 = pfVar30 + 0x18;
    }
  }
  else {
    pfVar30 = &values[0].dt.upper;
    for (sVar29 = 0; children.numChildren != sVar29; sVar29 = sVar29 + 1) {
      *(undefined8 *)(uVar38 + sVar29 * 8) = *(undefined8 *)(pfVar30 + -0x15);
      fVar74 = *pfVar30;
      fVar69 = ((BBox1f *)(pfVar30 + -1))->lower;
      fVar79 = 1.0 / (fVar74 - fVar69);
      fVar77 = -fVar69 * fVar79;
      fVar73 = 1.0 - fVar77;
      auVar65._0_4_ = pfVar30[-0x11] * fVar73 + pfVar30[-9] * fVar77;
      auVar65._4_4_ = pfVar30[-0x10] * fVar73 + pfVar30[-8] * fVar77;
      auVar65._8_4_ = pfVar30[-0xf] * fVar73 + pfVar30[-7] * fVar77;
      auVar65._12_4_ = pfVar30[-0xe] * fVar73 + pfVar30[-6] * fVar77;
      auVar68._0_4_ = fVar73 * pfVar30[-0xd] + fVar77 * pfVar30[-5];
      auVar68._4_4_ = fVar73 * pfVar30[-0xc] + fVar77 * pfVar30[-4];
      auVar68._8_4_ = fVar73 * pfVar30[-0xb] + fVar77 * pfVar30[-3];
      auVar68._12_4_ = fVar73 * pfVar30[-10] + fVar77 * pfVar30[-2];
      fVar79 = (1.0 - fVar69) * fVar79;
      fVar73 = 1.0 - fVar79;
      auVar72._0_4_ = pfVar30[-0x11] * fVar73 + pfVar30[-9] * fVar79;
      auVar72._4_4_ = pfVar30[-0x10] * fVar73 + pfVar30[-8] * fVar79;
      auVar72._8_4_ = pfVar30[-0xf] * fVar73 + pfVar30[-7] * fVar79;
      auVar72._12_4_ = pfVar30[-0xe] * fVar73 + pfVar30[-6] * fVar79;
      auVar71._0_4_ = fVar73 * pfVar30[-0xd] + fVar79 * pfVar30[-5];
      auVar71._4_4_ = fVar73 * pfVar30[-0xc] + fVar79 * pfVar30[-4];
      auVar71._8_4_ = fVar73 * pfVar30[-0xb] + fVar79 * pfVar30[-3];
      auVar71._12_4_ = fVar73 * pfVar30[-10] + fVar79 * pfVar30[-2];
      auVar65 = minps(auVar65,_DAT_01f4b860);
      auVar68 = maxps(auVar68,auVar48);
      auVar72 = minps(auVar72,_DAT_01f4b860);
      auVar71 = maxps(auVar71,auVar48);
      fVar78 = auVar65._0_4_ - ABS(auVar65._0_4_) * 4.7683716e-07;
      fVar80 = auVar65._4_4_ - ABS(auVar65._4_4_) * 4.7683716e-07;
      fVar81 = auVar65._8_4_ - ABS(auVar65._8_4_) * 4.7683716e-07;
      fVar73 = ABS(auVar68._0_4_) * 4.7683716e-07 + auVar68._0_4_;
      fVar79 = ABS(auVar68._4_4_) * 4.7683716e-07 + auVar68._4_4_;
      fVar77 = ABS(auVar68._8_4_) * 4.7683716e-07 + auVar68._8_4_;
      *(float *)(uVar38 + 0x20 + sVar29 * 4) = fVar78;
      *(float *)(uVar38 + 0x40 + sVar29 * 4) = fVar80;
      *(float *)(uVar38 + 0x60 + sVar29 * 4) = fVar81;
      *(float *)(uVar38 + 0x30 + sVar29 * 4) = fVar73;
      *(float *)(uVar38 + 0x50 + sVar29 * 4) = fVar79;
      *(float *)(uVar38 + 0x70 + sVar29 * 4) = fVar77;
      *(float *)(uVar38 + 0x80 + sVar29 * 4) =
           (auVar72._0_4_ - ABS(auVar72._0_4_) * 4.7683716e-07) - fVar78;
      *(float *)(uVar38 + 0xa0 + sVar29 * 4) =
           (auVar72._4_4_ - ABS(auVar72._4_4_) * 4.7683716e-07) - fVar80;
      *(float *)(uVar38 + 0xc0 + sVar29 * 4) =
           (auVar72._8_4_ - ABS(auVar72._8_4_) * 4.7683716e-07) - fVar81;
      *(float *)(uVar38 + 0x90 + sVar29 * 4) =
           (ABS(auVar71._0_4_) * 4.7683716e-07 + auVar71._0_4_) - fVar73;
      *(float *)(uVar38 + 0xb0 + sVar29 * 4) =
           (ABS(auVar71._4_4_) * 4.7683716e-07 + auVar71._4_4_) - fVar79;
      *(float *)(uVar38 + 0xd0 + sVar29 * 4) =
           (ABS(auVar71._8_4_) * 4.7683716e-07 + auVar71._8_4_) - fVar77;
      *(float *)(uVar38 + 0xe0 + sVar29 * 4) = fVar69;
      *(uint *)(uVar38 + 0xf0 + sVar29 * 4) =
           ~-(uint)(fVar74 == 1.0) & (uint)fVar74 | -(uint)(fVar74 == 1.0) & 0x3f800001;
      pfVar30 = pfVar30 + 0x18;
    }
  }
  if (bVar17) {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    bupper0.lower.field_0._0_8_ = 0x7f8000007f800000;
    bupper0.lower.field_0._8_8_ = 0x7f8000007f800000;
    bupper0.upper.field_0._0_8_ = 0xff800000ff800000;
    bupper0.upper.field_0._8_8_ = 0xff800000ff800000;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      blower1.lower.field_0._0_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      blower1.lower.field_0._8_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&bi,(anon_class_16_2_aeee9775 *)&vSplitPos,
                 (range<unsigned_long> *)&blower1);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&blower1,(context_traits)0x4,CUSTOM_CTX);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&bi,(d1 *)&right,(blocked_range<unsigned_long> *)&bupper0,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&blower1,local_1e68._0_8_);
      cVar21 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&blower1);
      if (cVar21 != '\0') {
        prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar26,"task cancelled");
        __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&blower1);
    }
    (__return_storage_ptr__->ref).ptr = local_1e40;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = bi.lower.field_0._0_8_
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         bi.lower.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = bi.upper.field_0._0_8_
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         bi.upper.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1da8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1da8._8_8_;
  }
  else {
    (__return_storage_ptr__->ref).ptr = local_1e40;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1e58._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1e58._8_8_;
    *(task_group_context **)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         local_1e68._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         uStack_1e60;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1e18._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1e18._8_8_;
    local_1d98[0]._0_8_ = local_1e28._0_8_;
    local_1d98[0]._8_8_ = local_1e28._8_8_;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1d98[0]._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1d98[0]._8_8_;
  BVar16.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  BVar16.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
  __return_storage_ptr__->dt = BVar16;
  for (uVar38 = 0; uVar38 < children.numChildren; uVar38 = uVar38 + 1) {
    pSVar5 = children.primvecs.items[uVar38];
    psVar1 = &pSVar5->refCount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      pvVar28 = pSVar5->prims;
      if (pvVar28 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar29 = pvVar28->size_alloced;
        pPVar6 = pvVar28->items;
        if (pPVar6 != (PrimRefMB *)0x0) {
          if (sVar29 * 0x50 < 0x1c00000) {
            alignedFree(pPVar6);
          }
          else {
            os_free(pPVar6,sVar29 * 0x50,(pvVar28->alloc).hugepages);
          }
        }
        if (sVar29 != 0) {
          pMVar7 = (pvVar28->alloc).device;
          (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar29 * -0x50,1);
        }
        pvVar28->size_active = 0;
        pvVar28->size_alloced = 0;
        pvVar28->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }